

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_AsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  long lVar1;
  InterpreterStackFrame *pIVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  RegSlot RVar6;
  RegSlot RVar7;
  RecyclableObject *function;
  JavascriptMethod p_Var8;
  Var pvVar9;
  undefined4 *puVar10;
  undefined8 *puVar11;
  Arguments local_60;
  Arguments local_50;
  Type local_40;
  undefined1 local_31;
  
  function = JavascriptOperators::GetCallableObjectOrThrow
                       (*(Var *)(*(long *)(this + 0x120) + (ulong)playout->Function * 8),
                        *(ScriptContext **)(this + 0x78));
  lVar1 = *(long *)(*(long *)(this + 0x88) + 0x20);
  if (((*(long *)(lVar1 + 0x80) != 0) || ((*(byte *)(lVar1 + 0xa8) & 0x20) != 0)) &&
     ((*(byte *)(lVar1 + 0xa8) & 0x40) != 0)) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function);
  }
  lVar1 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  local_31 = *(undefined1 *)(lVar1 + 0x10a);
  *(undefined1 *)(lVar1 + 0x10a) = 1;
  uVar5 = playout->ArgCount;
  local_40 = *(Type *)(this + 0x28);
  if (playout->Return == 0xffffffff) {
    p_Var8 = RecyclableObject::GetEntryPoint(function);
    local_60.Info = (Type)((ulong)uVar5 | 0x10000000);
    local_60.Values = local_40;
    JavascriptFunction::CallFunction<true>(function,p_Var8,&local_60,false);
  }
  else {
    p_Var8 = RecyclableObject::GetEntryPoint(function);
    local_50.Info = (Type)((ulong)uVar5 | 0x2000000);
    local_50.Values = local_40;
    pvVar9 = JavascriptFunction::CallFunction<true>(function,p_Var8,&local_50,false);
    *(Var *)(*(long *)(this + 0x120) + (ulong)playout->Return * 8) = pvVar9;
  }
  *(undefined1 *)(lVar1 + 0x10a) = local_31;
  uVar5 = playout->ArgCount + 1;
  if (uVar5 == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  puVar11 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)uVar5 * -8);
  *(undefined8 **)(this + 0x30) = puVar11;
  *(undefined8 *)(this + 0x28) = *puVar11;
  RVar6 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar2 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar6 * 8 + 0x160 <= pIVar2) {
    RVar6 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar7 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar2 < this + (ulong)RVar7 * 8 + (ulong)RVar6 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar10 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar4) {
    *puVar10 = 0;
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void InterpreterStackFrame::OP_AsmCall(const unaligned T* playout)
    {
        Var target = GetRegRawPtr(playout->Function);

        RecyclableObject * function = OP_CallGetFunc(target);

#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif

        BEGIN_SAFE_REENTRANT_REGION(this->scriptContext->GetThreadContext())
        {
            if (playout->Return == Js::Constants::NoRegister)

            {
                Arguments args(CallInfo(CallFlags_NotUsed, playout->ArgCount), m_outParams);
                JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
            }
            else
            {
                Arguments args(CallInfo(CallFlags_Value, playout->ArgCount), m_outParams);
                Var retVal = JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                SetRegRawPtr(playout->Return, retVal);
            }
        }
        END_SAFE_REENTRANT_REGION

            PopOut(playout->ArgCount);
    }